

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_node_flags
                 (lysc_ctx *ctx,uint16_t parsed_flags,uint16_t inherited_flags,lysc_node *node)

{
  uint16_t *stmt_flags;
  uint uVar1;
  lysc_node *plVar2;
  bool bVar3;
  ushort uVar4;
  uint16_t parent_flags;
  LY_ERR LVar5;
  ushort uVar6;
  char *parent_name;
  
  uVar4 = parsed_flags & 0xe3;
  node->flags = uVar4;
  if (((parsed_flags & 3) != 0) && (node->nodetype == 0x80)) {
    __assert_fail("(node->nodetype != LYS_CASE) || !(node->flags & LYS_CONFIG_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0xa41,"LY_ERR lys_compile_config(struct lysc_ctx *, struct lysc_node *)");
  }
  if ((ctx->compile_opts & 4) == 0) {
    if ((parsed_flags & 3) == 0) {
      plVar2 = node->parent;
      if (plVar2 != (lysc_node *)0x0) {
        uVar6 = plVar2->flags & 3;
        if (uVar6 != 0) {
          uVar4 = uVar6 | uVar4;
          goto LAB_0014aed3;
        }
        if (-1 < (short)plVar2->nodetype) {
          __assert_fail("!node->parent || (node->parent->flags & LYS_CONFIG_MASK) || (node->parent->nodetype & LYS_AUGMENT)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                        ,0xa48,"LY_ERR lys_compile_config(struct lysc_ctx *, struct lysc_node *)");
        }
      }
      uVar4 = uVar4 | 1;
    }
    else {
      uVar4 = uVar4 | 0x800;
    }
  }
  else {
    uVar4 = parsed_flags & 0xe0;
  }
LAB_0014aed3:
  stmt_flags = &node->flags;
  node->flags = uVar4;
  bVar3 = true;
  LVar5 = LY_SUCCESS;
  if (((node->parent != (lysc_node *)0x0) && (LVar5 = LY_SUCCESS, (node->parent->flags & 2) != 0))
     && ((*stmt_flags & 1) != 0)) {
    bVar3 = false;
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
            "Configuration node cannot be child of any state data node.");
    LVar5 = LY_EVALID;
  }
  if (bVar3) {
    plVar2 = node->parent;
    if (plVar2 == (lysc_node *)0x0) {
      parent_flags = 0;
      parent_name = (char *)0x0;
    }
    else {
      parent_flags = plVar2->flags;
      parent_name = plVar2->name;
    }
    LVar5 = lys_compile_status(ctx,parsed_flags,inherited_flags,parent_flags,parent_name,node->name,
                               stmt_flags);
    if ((LVar5 == LY_SUCCESS) &&
       ((((uVar1 = ctx->compile_opts, (uVar1 >> 0xc & 1) != 0 &&
          (uVar4 = 0x1000, node->nodetype != 0x1000)) ||
         (((uVar1 >> 0xd & 1) != 0 && (uVar4 = 0x2000, node->nodetype != 0x2000)))) ||
        ((LVar5 = LY_SUCCESS, (uVar1 >> 0xe & 1) != 0 && (uVar4 = 0x4000, node->nodetype != 0x400)))
        ))) {
      *stmt_flags = *stmt_flags | uVar4;
      LVar5 = LY_SUCCESS;
    }
  }
  return LVar5;
}

Assistant:

static LY_ERR
lys_compile_node_flags(struct lysc_ctx *ctx, uint16_t parsed_flags, uint16_t inherited_flags, struct lysc_node *node)
{
    uint16_t parent_flags;
    const char *parent_name;

    /* copy flags except for status */
    node->flags = (parsed_flags & LYS_FLAGS_COMPILED_MASK) & ~LYS_STATUS_MASK;

    /* inherit config flags */
    LY_CHECK_RET(lys_compile_config(ctx, node));

    /* compile status */
    parent_flags = node->parent ? node->parent->flags : 0;
    parent_name = node->parent ? node->parent->name : NULL;
    LY_CHECK_RET(lys_compile_status(ctx, parsed_flags, inherited_flags, parent_flags, parent_name, node->name, &node->flags));

    /* other flags */
    if ((ctx->compile_opts & LYS_IS_INPUT) && (node->nodetype != LYS_INPUT)) {
        node->flags |= LYS_IS_INPUT;
    } else if ((ctx->compile_opts & LYS_IS_OUTPUT) && (node->nodetype != LYS_OUTPUT)) {
        node->flags |= LYS_IS_OUTPUT;
    } else if ((ctx->compile_opts & LYS_IS_NOTIF) && (node->nodetype != LYS_NOTIF)) {
        node->flags |= LYS_IS_NOTIF;
    }

    return LY_SUCCESS;
}